

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_channel.c
# Opt level: O3

int ChnlIotDevicePushCmd(uint32_t cmd,char *payload,uint32_t payload_len)

{
  undefined4 in_EAX;
  int iVar1;
  int iVar2;
  int iVar3;
  CommAttribute attr;
  undefined8 uVar4;
  
  uVar4 = CONCAT44(1,in_EAX);
  if (g_channel.inited == 0) {
    iVar1 = LogLevelValid(0);
    iVar3 = -1;
    if (iVar1 != 0) {
      LogWrite(0,"channel","ChnlIotDevicePushCmd",0x132,"module not init");
    }
  }
  else {
    iVar1 = CommProtocolPacketAssembleAndSend
                      ((CommCmd)cmd,payload,(CommPayloadLen)payload_len,
                       (CommAttribute *)&stack0xffffffffffffffec);
    if (iVar1 == 0) {
      iVar3 = 0;
    }
    else {
      iVar2 = LogLevelValid(2);
      iVar3 = -1;
      if (iVar2 != 0) {
        LogWrite(2,"channel","ChnlIotDevicePushCmd",0x13b,"transmit failed. err=%d",iVar1,uVar4);
      }
    }
  }
  return iVar3;
}

Assistant:

int ChnlIotDevicePushCmd(uint32_t cmd, char *payload, uint32_t payload_len) {
  CommAttribute attr = {1};
  if (!_is_channel_inited()) {
    LOGE(TAG, "module not init");
    return -1;
  }

  int ret = CommProtocolPacketAssembleAndSend(cmd,
                                              payload,
                                              payload_len,
                                              &attr);
  if (ret != 0) {
    LOGT(TAG, "transmit failed. err=%d", ret);
    return -1;
  }
  return 0;
}